

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O3

ngx_int_t ngx_http_discard_request_body(ngx_http_request_t *r)

{
  ngx_event_t *ev;
  ngx_buf_t *b;
  ngx_int_t nVar1;
  ulong uVar2;
  
  if (((r->main == r) && ((r->field_0x469 & 0x10) == 0)) &&
     (r->request_body == (ngx_http_request_body_t *)0x0)) {
    nVar1 = ngx_http_test_expect(r);
    if (nVar1 != 0) {
      return 500;
    }
    ev = r->connection->read;
    if ((ev->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,ev->log,0,"http set discard body");
    }
    if ((ev->field_0x9 & 8) != 0) {
      ngx_event_del_timer(ev);
    }
    if ((0 < (r->headers_in).content_length_n) || (((r->headers_in).field_0x168 & 4) != 0)) {
      b = r->header_in;
      if ((b->last != b->pos) || (((r->headers_in).field_0x168 & 4) != 0)) {
        nVar1 = ngx_http_discard_request_body_filter(r,b);
        if (nVar1 != 0) {
          return nVar1;
        }
        if ((r->headers_in).content_length_n == 0) {
          return 0;
        }
      }
      nVar1 = ngx_http_read_discarded_request_body(r);
      if (nVar1 == 0) {
        uVar2 = *(ulong *)&r->field_0x468 & 0xfffffffffffff7ff;
      }
      else {
        if (299 < nVar1) {
          return nVar1;
        }
        r->read_event_handler = ngx_http_discarded_request_body_handler;
        nVar1 = ngx_handle_read_event(ev,0);
        if (nVar1 != 0) {
          return 500;
        }
        *(short *)&r->field_0x460 = *(short *)&r->field_0x460 + 1;
        uVar2 = *(ulong *)&r->field_0x468 | 0x1000;
      }
      *(ulong *)&r->field_0x468 = uVar2;
    }
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_http_discard_request_body(ngx_http_request_t *r)
{
    ssize_t       size;
    ngx_int_t     rc;
    ngx_event_t  *rev;

    if (r != r->main || r->discard_body || r->request_body) {
        return NGX_OK;
    }

#if (NGX_HTTP_V2)
    if (r->stream) {
        r->stream->skip_data = 1;
        return NGX_OK;
    }
#endif

    if (ngx_http_test_expect(r) != NGX_OK) {
        return NGX_HTTP_INTERNAL_SERVER_ERROR;
    }

    rev = r->connection->read;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, rev->log, 0, "http set discard body");

    if (rev->timer_set) {
        ngx_del_timer(rev);
    }

    if (r->headers_in.content_length_n <= 0 && !r->headers_in.chunked) {
        return NGX_OK;
    }

    size = r->header_in->last - r->header_in->pos;

    if (size || r->headers_in.chunked) {
        rc = ngx_http_discard_request_body_filter(r, r->header_in);

        if (rc != NGX_OK) {
            return rc;
        }

        if (r->headers_in.content_length_n == 0) {
            return NGX_OK;
        }
    }

    rc = ngx_http_read_discarded_request_body(r);

    if (rc == NGX_OK) {
        r->lingering_close = 0;
        return NGX_OK;
    }

    if (rc >= NGX_HTTP_SPECIAL_RESPONSE) {
        return rc;
    }

    /* rc == NGX_AGAIN */

    r->read_event_handler = ngx_http_discarded_request_body_handler;

    if (ngx_handle_read_event(rev, 0) != NGX_OK) {
        return NGX_HTTP_INTERNAL_SERVER_ERROR;
    }

    r->count++;
    r->discard_body = 1;

    return NGX_OK;
}